

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ComputeGravityForces
          (ChElementHexaANCF_3813_9 *this,ChVectorDynamic<> *Fg,ChVector<double> *G_acc)

{
  Map<Eigen::Matrix<double,_11,_3,_1,_11,_3>,_0,_Eigen::Stride<0,_0>_> GravForceCompact;
  Product<Eigen::Matrix<double,_11,_1,_0,_11,_1>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>
  local_30;
  
  if ((Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows == 0x21)
  {
    Eigen::MapBase<Eigen::Map<Eigen::Matrix<double,_11,_3,_1,_11,_3>,_0,_Eigen::Stride<0,_0>_>,_0>::
    MapBase((MapBase<Eigen::Map<Eigen::Matrix<double,_11,_3,_1,_11,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
             *)&GravForceCompact,
            (Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,
            0xb,3);
    local_30.m_lhs = &this->m_GravForceScale;
    local_30.m_rhs.m_matrix.
    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_data = G_acc->m_data;
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,11,3,1,11,3>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Matrix<double,11,1,0,11,1>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>>
              (&GravForceCompact,&local_30);
    return;
  }
  __assert_fail("Fg.size() == 33",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementHexaANCF_3813_9.cpp"
                ,0x10e,
                "virtual void chrono::fea::ChElementHexaANCF_3813_9::ComputeGravityForces(ChVectorDynamic<> &, const ChVector<> &)"
               );
}

Assistant:

void ChElementHexaANCF_3813_9::ComputeGravityForces(ChVectorDynamic<>& Fg, const ChVector<>& G_acc) {
    assert(Fg.size() == 33);

    // Calculate and add the generalized force due to gravity to the generalized internal force vector for the element.
    // The generalized force due to gravity could be computed once prior to the start of the simulation if gravity was
    // assumed constant throughout the entire simulation.  However, this implementation assumes that the acceleration
    // due to gravity, while a constant for the entire system, can change from step to step which could be useful for
    // gravity loaded units tests as an example.  The generalized force due to gravity is calculated in compact matrix
    // form and is pre-mapped to the desired vector format
    Eigen::Map<ChMatrixNM<double, 11, 3>> GravForceCompact(Fg.data(), 11, 3);
    GravForceCompact = m_GravForceScale * G_acc.eigen().transpose();
}